

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ConsumeSignedInteger(Parser *this,int *output,char *error)

{
  bool bVar1;
  uint64 local_40;
  uint64 value;
  uint64 max_value;
  char *pcStack_28;
  bool is_negative;
  char *error_local;
  int *output_local;
  Parser *this_local;
  
  max_value._7_1_ = 0;
  value = 0x7fffffff;
  pcStack_28 = error;
  error_local = (char *)output;
  output_local = (int *)this;
  bVar1 = TryConsume(this,"-");
  if (bVar1) {
    max_value._7_1_ = 1;
    value = value + 1;
  }
  local_40 = 0;
  bVar1 = ConsumeInteger64(this,value,&local_40,pcStack_28);
  if (bVar1) {
    if ((max_value._7_1_ & 1) != 0) {
      local_40 = -local_40;
    }
    *(int *)error_local = (int)local_40;
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Parser::ConsumeSignedInteger(int* output, const char* error) {
  bool is_negative = false;
  uint64 max_value = kint32max;
  if (TryConsume("-")) {
    is_negative = true;
    max_value += 1;
  }
  uint64 value = 0;
  DO(ConsumeInteger64(max_value, &value, error));
  if (is_negative) value *= -1;
  *output = value;
  return true;
}